

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_chi2_test<trng::cauchy_dist<float>>(cauchy_dist<float> *d)

{
  double dVar1;
  pointer __s;
  ulong uVar2;
  long lVar3;
  int i;
  int iVar4;
  int i_1;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  parameter_type P;
  vector<float,_std::allocator<float>_> quantil;
  lcg64_shift R;
  AssertionHandler catchAssertionHandler;
  vector<float,_std::allocator<float>_> local_118;
  undefined1 local_f8 [16];
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  lcg64_shift local_b8;
  StringRef local_a0;
  AssertionHandler local_90;
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  __s = (pointer)operator_new(0x200);
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       __s;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x80;
  memset(__s,0,0x200);
  iVar4 = 1;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       __s + 0x80;
  do {
    local_90.m_assertionInfo.macroName.m_start._0_4_ =
         trng::cauchy_dist<float>::icdf(d,(float)iVar4 * 0.0078125);
    if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_118,
                 (iterator)
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_90);
    }
    else {
      *local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_90.m_assertionInfo.macroName.m_start._0_4_;
      local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x80);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_b8,P);
  iVar4 = 0;
  do {
    local_b8.S.r = local_b8.S.r * local_b8.P.a + local_b8.P.b;
    uVar2 = local_b8.S.r >> 0x11 ^ local_b8.S.r;
    uVar2 = uVar2 << 0x1f ^ uVar2;
    fVar5 = ((float)(uVar2 >> 1 ^ uVar2 >> 9) * 1.0842019e-19 + 1.1920929e-07) * 3.1415927;
    fVar7 = (d->P).theta_;
    local_f8._0_4_ = (d->P).eta_;
    fVar6 = cosf(fVar5);
    fVar5 = sinf(fVar5);
    fVar7 = (float)local_f8._0_4_ - (fVar6 * fVar7) / fVar5;
    uVar2 = 0;
    do {
      if (fVar7 < local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2] ||
          fVar7 == local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2]) goto LAB_002187eb;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x7f);
    uVar2 = 0x7f;
LAB_002187eb:
    __s[uVar2 & 0xffffffff] = __s[uVar2 & 0xffffffff] + 1;
    iVar4 = iVar4 + 1;
    if (iVar4 == 10000) {
      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x400);
      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x80;
      lVar3 = 0;
      do {
        local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar3] = 0.0078125;
        (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3)[1] = 0.0078125;
        lVar3 = lVar3 + 2;
      } while (lVar3 != 0x80);
      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      dVar1 = chi_percentil(&local_d0,&local_e8);
      local_f8._8_4_ = extraout_XMM0_Dc;
      local_f8._0_8_ = dVar1;
      local_f8._12_4_ = extraout_XMM0_Dd;
      local_a0.m_start = "REQUIRE";
      local_a0.m_size = 7;
      local_38.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_38.line = 0xc2;
      Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
      Catch::AssertionHandler::AssertionHandler(&local_90,&local_a0,&local_38,local_48,Normal);
      local_a0.m_start =
           (char *)(CONCAT71(local_a0.m_start._1_7_,
                             -((double)local_f8._0_8_ < 0.99) & -(0.01 < (double)local_f8._0_8_)) &
                   0xffffffffffffff01);
      Catch::AssertionHandler::handleExpr<bool>(&local_90,(ExprLhs<bool> *)&local_a0);
      Catch::AssertionHandler::complete(&local_90);
      if (local_90.m_completed == false) {
        (*(local_90.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}